

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorImpl<std::__cxx11::string>::append<llvm::StringRef_const*,void>
          (SmallVectorImpl<std::__cxx11::string> *this,StringRef *in_start,StringRef *in_end)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (long)in_end - (long)in_start >> 4;
  uVar1 = (ulong)*(uint *)(this + 8);
  if (*(uint *)(this + 0xc) - uVar1 < uVar2) {
    SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ::grow((SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            *)this,uVar1 + uVar2);
    uVar1 = (ulong)*(uint *)(this + 8);
  }
  std::__uninitialized_copy<false>::__uninit_copy<llvm::StringRef_const*,std::__cxx11::string*>
            (in_start,in_end,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (uVar1 * 0x20 + *(long *)this));
  if (uVar2 + *(uint *)(this + 8) <= (ulong)*(uint *)(this + 0xc)) {
    *(int *)(this + 8) = (int)(uVar2 + *(uint *)(this + 8));
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }